

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O2

int Test_N_VWrmsNormMaskVectorArray(N_Vector X,sunindextype param_2,int myid)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  int local_74;
  double local_70;
  double local_58;
  double dStack_50;
  double local_48;
  sunindextype local_38;
  
  lVar6 = N_VGetLength();
  dVar1 = (double)(lVar6 + -1) / (double)lVar6;
  local_70 = 0.0;
  if (0.0 < dVar1) {
    if (dVar1 < 0.0) {
      local_70 = sqrt(dVar1);
    }
    else {
      local_70 = SQRT(dVar1);
    }
  }
  puVar7 = (undefined8 *)N_VCloneVectorArray(3,X);
  puVar8 = (undefined8 *)N_VCloneVectorArray(3,X);
  N_VConst(0,*puVar7);
  N_VConst(0,*puVar8);
  N_VConst(0,X);
  if (myid == 0) {
    set_element(X,param_2 + -1,0.0);
  }
  local_58 = -1.0;
  dStack_50 = -1.0;
  local_48 = -1.0;
  local_38 = param_2;
  dVar1 = get_time();
  iVar3 = N_VWrmsNormMaskVectorArray(1,puVar7,puVar8,X,&local_58);
  sync_device(X);
  dVar2 = get_time();
  if (((iVar3 != 0) || (local_58 < 0.0)) || (iVar3 = SUNRCompare(), iVar3 != 0)) {
    printf(">>> FAILED test -- N_VWrmsNormMaskVectorArray Case 1, Proc %d \n",(ulong)(uint)myid);
    local_74 = 1;
  }
  else {
    local_74 = 0;
    if (myid == 0) {
      puts("PASSED test -- N_VWrmsNormMaskVectorArray Case 1 ");
    }
  }
  dVar1 = max_time(X,dVar2 - dVar1);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar1,0),"N_VWrmsNormVectorArray");
  }
  N_VConst(0,*puVar7);
  N_VConst(0,puVar7[1]);
  N_VConst(0,puVar7[2]);
  N_VConst(0,*puVar8);
  N_VConst(0,puVar8[1]);
  N_VConst(0,puVar8[2]);
  N_VConst(0,X);
  if (myid == 0) {
    set_element(X,local_38 + -1,0.0);
  }
  local_58 = -1.0;
  dStack_50 = -1.0;
  local_48 = -1.0;
  dVar1 = get_time();
  iVar3 = N_VWrmsNormMaskVectorArray(3,puVar7,puVar8,X,&local_58);
  sync_device(X);
  dVar2 = get_time();
  if (iVar3 == 0) {
    iVar3 = 1;
    if (0.0 <= local_58) {
      iVar3 = SUNRCompare();
    }
    iVar4 = 1;
    if (0.0 <= dStack_50) {
      iVar4 = SUNRCompare();
    }
    iVar5 = 1;
    if (0.0 <= local_48) {
      iVar5 = SUNRCompare(SUB84(local_48,0),local_70 * 0.5);
    }
    if (iVar4 + iVar3 + iVar5 == 0) {
      if (myid == 0) {
        puts("PASSED test -- N_VWrmsNormMaskVectorArray Case 2 ");
      }
      goto LAB_00109511;
    }
  }
  printf(">>> FAILED test -- N_VWrmsNormMaskVectorArray Case 2, Proc %d \n",(ulong)(uint)myid);
  local_74 = local_74 + 1;
LAB_00109511:
  dVar1 = max_time(X,dVar2 - dVar1);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar1,0),"N_VWrmsNormVectorArray");
  }
  N_VDestroyVectorArray(puVar7,3);
  N_VDestroyVectorArray(puVar8,3);
  return local_74;
}

Assistant:

int Test_N_VWrmsNormMaskVectorArray(N_Vector X, sunindextype local_length,
                                    int myid)
{
  int fails = 0, failure = 0, ierr = 0;
  double start_time, stop_time, maxt;
  sunindextype global_length;

  sunrealtype fac;
  sunrealtype nrm[3];
  N_Vector* Z;
  N_Vector* W;

  /* get global length */
  global_length = N_VGetLength(X);

  /* factor used in checking solutions */
  fac = SUNRsqrt((sunrealtype)(global_length - 1) / (global_length));

  /* create vectors for testing */
  Z = N_VCloneVectorArray(3, X);
  W = N_VCloneVectorArray(3, X);

  /*
   * Case 1: nrm[0] = ||Z[0]||
   */

  /* fill vector data */
  N_VConst(NEG_HALF, Z[0]);
  N_VConst(HALF, W[0]);

  /* use all elements except one */
  N_VConst(ONE, X);
  if (myid == 0) { set_element(X, local_length - 1, ZERO); }

  nrm[0] = NEG_ONE;
  nrm[1] = NEG_ONE;
  nrm[2] = NEG_ONE;

  start_time = get_time();
  ierr       = N_VWrmsNormMaskVectorArray(1, Z, W, X, nrm);
  sync_device(X);
  stop_time = get_time();

  /* nrm should equal fac/4 */
  if (ierr == 0)
  {
    failure = (nrm[0] < ZERO) ? 1 : SUNRCompare(nrm[0], fac * HALF * HALF);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VWrmsNormMaskVectorArray Case 1, Proc %d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VWrmsNormMaskVectorArray Case 1 \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VWrmsNormVectorArray", maxt);

  /*
   * Case 2: nrm[i] = ||Z[i]||
   */

  /* fill vector data */
  N_VConst(NEG_HALF, Z[0]);
  N_VConst(TWO * TWO, Z[1]);
  N_VConst(HALF, Z[2]);

  N_VConst(HALF, W[0]);
  N_VConst(HALF * HALF, W[1]);
  N_VConst(ONE, W[2]);

  /* use all elements except one */
  N_VConst(ONE, X);
  if (myid == 0) { set_element(X, local_length - 1, ZERO); }

  nrm[0] = NEG_ONE;
  nrm[1] = NEG_ONE;
  nrm[2] = NEG_ONE;

  start_time = get_time();
  ierr       = N_VWrmsNormMaskVectorArray(3, Z, W, X, nrm);
  sync_device(X);
  stop_time = get_time();

  /* ans should equal fac/4, fac, fac/2] */
  if (ierr == 0)
  {
    failure = (nrm[0] < ZERO) ? 1 : SUNRCompare(nrm[0], fac * HALF * HALF);
    failure += (nrm[1] < ZERO) ? 1 : SUNRCompare(nrm[1], fac);
    failure += (nrm[2] < ZERO) ? 1 : SUNRCompare(nrm[2], fac * HALF);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VWrmsNormMaskVectorArray Case 2, Proc %d \n",
           myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VWrmsNormMaskVectorArray Case 2 \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VWrmsNormVectorArray", maxt);

  /* Free vectors */
  N_VDestroyVectorArray(Z, 3);
  N_VDestroyVectorArray(W, 3);

  return (fails);
}